

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

bool __thiscall xray_re::xr_file_system::create_path(xr_file_system *this,char *path)

{
  bool bVar1;
  undefined1 local_48 [8];
  CPath p;
  char *path_local;
  xr_file_system *this_local;
  
  p.super_path._32_8_ = path;
  bVar1 = read_only(this);
  if (bVar1) {
    dbg("fs_ro: creating path %s",p.super_path._32_8_);
    this_local._7_1_ = true;
  }
  else {
    CPath::CPath((CPath *)local_48,(char *)p.super_path._32_8_);
    CPath::make_preferred_abi_cxx11_((CPath *)local_48);
    bVar1 = std::filesystem::exists((path *)local_48);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = CPath::create_directory_recursive((CPath *)local_48);
    }
    CPath::~CPath((CPath *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool xr_file_system::create_path(const char* path) const
{
	if(read_only())
	{
		dbg("fs_ro: creating path %s", path);

		return true;
	}
	else
	{
		CPath p(path);

		p.make_preferred();
		if(fs::exists(p))
			return true;

		return p.create_directory_recursive();
	}
}